

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O2

string * __thiscall
Diligent::FormatString<char[23],char_const*,char[20],unsigned_int,char[5],unsigned_long,char[140]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [23],char **Args_1,
          char (*Args_2) [20],uint *Args_3,char (*Args_4) [5],unsigned_long *Args_5,
          char (*Args_6) [140])

{
  stringstream ss;
  stringstream local_1b8 [392];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[23],char_const*,char[20],unsigned_int,char[5],unsigned_long,char[140]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [23])this,(char **)Args,(char (*) [20])Args_1,(uint *)Args_2,
             (char (*) [5])Args_3,(unsigned_long *)Args_4,(char (*) [140])Args_5);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}